

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

Result<Sample> * __thiscall
vkb::Result<Sample>::operator=(Result<Sample> *this,Result<Sample> *result)

{
  bool bVar1;
  int *piVar2;
  
  destroy(this);
  bVar1 = result->m_init;
  this->m_init = bVar1;
  if (bVar1 == true) {
    Sample::Sample((Sample *)this,(Sample *)result);
  }
  else {
    (this->field_0).m_error.vk_result = (result->field_0).m_error.vk_result;
    piVar2 = (result->field_0).m_value.data;
    (this->field_0).m_value._vptr_Sample = (result->field_0).m_value._vptr_Sample;
    (this->field_0).m_value.data = piVar2;
  }
  return this;
}

Assistant:

Result& operator=(Result const& result) noexcept {
        destroy();
        m_init = result.m_init;
        if (m_init)
            new (&m_value) T{ result.m_value };
        else
            m_error = result.m_error;
        return *this;
    }